

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::GLSLtoSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          GLSLtoSPIRVAttribs *Attribs)

{
  SpirvVersion SVar1;
  EShLanguage s;
  spv_target_env TargetEnv;
  char (*in_RCX) [61];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV;
  EProfile shProfile;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1a8;
  int Lengths [1];
  string Preamble;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  char *ShaderStrings [1];
  TShader Shader;
  IncluderImpl Includer;
  
  if ((Attribs->ShaderSource == (char *)0x0) || (Attribs->SourceCodeLen < 1)) {
    FormatString<char[26],char[61]>
              ((string *)&Shader,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0",in_RCX)
    ;
    DebugAssertionFailed
              ((Char *)Shader._vptr_TShader,"GLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1f9);
    std::__cxx11::string::~string((string *)&Shader);
  }
  s = anon_unknown_3::ShaderTypeToShLanguage(Attribs->ShaderType);
  glslang::TShader::TShader(&Shader,s);
  shProfile = ENoProfile;
  anon_unknown_3::SetupWithSpirvVersion(&Shader,&shProfile,s,Attribs->Version,EShSourceGlsl);
  SVar1 = Attribs->Version;
  ShaderStrings[0] = Attribs->ShaderSource;
  Lengths[0] = Attribs->SourceCodeLen;
  glslang::TShader::setStringsWithLengths(&Shader,ShaderStrings,Lengths,1);
  Preamble._M_dataplus._M_p = (pointer)&Preamble.field_2;
  Preamble._M_string_length = 0;
  Preamble.field_2._M_local_buf[0] = '\0';
  if (Attribs->UseRowMajorMatrices == true) {
    std::__cxx11::string::append((char *)&Preamble);
  }
  std::__cxx11::string::append((char *)&Preamble);
  if (((Attribs->Macros).Elements != (ShaderMacro *)0x0) && ((Attribs->Macros).Count != 0)) {
    AppendShaderMacros(&Preamble,&Attribs->Macros);
  }
  Shader.preamble = Preamble._M_dataplus._M_p;
  Includer.m_pInputStreamFactory = Attribs->pShaderSourceStreamFactory;
  Includer.m_IncludeRes._M_h._M_buckets = &Includer.m_IncludeRes._M_h._M_single_bucket;
  Includer.super_Includer._vptr_Includer = (_func_int **)&PTR_includeSystem_00899120;
  Includer.m_IncludeRes._M_h._M_bucket_count = 1;
  Includer.m_IncludeRes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_IncludeRes._M_h._M_element_count = 0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_IncludeRes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Includer.m_DataBlobs._M_h._M_buckets = &Includer.m_DataBlobs._M_h._M_single_bucket;
  Includer.m_DataBlobs._M_h._M_bucket_count = 1;
  Includer.m_DataBlobs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_DataBlobs._M_h._M_element_count = 0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_DataBlobs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  anon_unknown_3::CompileShaderInternal
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,&Shader,
             (uint)((SVar1 & ~Vk110) != GL) << 4 | EShMsgSpvRules,&Includer.super_Includer,
             Attribs->ShaderSource,(long)Attribs->SourceCodeLen,Attribs->AssignBindings,shProfile,
             Attribs->ppCompilerOutput);
  if (local_1a8._M_impl.super__Vector_impl_data._M_start ==
      local_1a8._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = local_1a8._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = local_1a8._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    TargetEnv = anon_unknown_3::SpirvVersionToSpvTargetEnv(Attribs->Version);
    SrcSPIRV = &local_1a8;
    OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)SrcSPIRV,TargetEnv,
                  SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (local_168._M_impl.super__Vector_impl_data._M_start ==
        local_168._M_impl.super__Vector_impl_data._M_finish) {
      LogError<false,char[27]>
                (false,"GLSLtoSPIRV",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x220,(char (*) [27])"Failed to optimize SPIR-V.");
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = local_1a8._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_1a8._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = local_168._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_168._M_impl.super__Vector_impl_data._M_finish;
      SrcSPIRV = &local_168;
    }
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl
         ).super__Vector_impl_data._M_end_of_storage;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_168);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1a8);
  anon_unknown_3::IncluderImpl::~IncluderImpl(&Includer);
  std::__cxx11::string::~string((string *)&Preamble);
  glslang::TShader::~TShader(&Shader);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> GLSLtoSPIRV(const GLSLtoSPIRVAttribs& Attribs)
{
    VERIFY_EXPR(Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0);

    const EShLanguage  ShLang = ShaderTypeToShLanguage(Attribs.ShaderType);
    ::glslang::TShader Shader(ShLang);
    ::EProfile         shProfile = EProfile::ENoProfile;

    SetupWithSpirvVersion(Shader, shProfile, ShLang, Attribs.Version, ::glslang::EShSourceGlsl);

    EShMessages messages = EShMsgSpvRules;
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");
    if (Attribs.Version != SpirvVersion::GL && Attribs.Version != SpirvVersion::GLES)
        messages = static_cast<EShMessages>(messages | EShMsgVulkanRules);

    const char* ShaderStrings[] = {Attribs.ShaderSource};
    int         Lengths[]       = {Attribs.SourceCodeLen};
    Shader.setStringsWithLengths(ShaderStrings, Lengths, 1);

    std::string Preamble;
    if (Attribs.UseRowMajorMatrices)
        Preamble += "layout(row_major) uniform;\n\n";
    Preamble.append("#define GLSLANG\n\n");
    if (Attribs.Macros)
        AppendShaderMacros(Preamble, Attribs.Macros);
    Shader.setPreamble(Preamble.c_str());

    IncluderImpl Includer{Attribs.pShaderSourceStreamFactory};

    auto SPIRV = CompileShaderInternal(Shader, messages, &Includer, Attribs.ShaderSource, Attribs.SourceCodeLen, Attribs.AssignBindings, shProfile, Attribs.ppCompilerOutput);
    if (SPIRV.empty())
        return SPIRV;

#ifdef USE_SPIRV_TOOLS
    auto OptimizedSPIRV = OptimizeSPIRV(SPIRV, SpirvVersionToSpvTargetEnv(Attribs.Version), SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (!OptimizedSPIRV.empty())
    {
        return OptimizedSPIRV;
    }
    else
    {
        LOG_ERROR("Failed to optimize SPIR-V.");
    }
#endif
    return SPIRV;
}